

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlineparser.cpp
# Opt level: O3

bool __thiscall QCommandLineParserPrivate::parse(QCommandLineParserPrivate *this,QStringList *args)

{
  QStringList *this_00;
  QHash<long_long,_QList<QString>_> *this_01;
  byte bVar1;
  QArrayData *data;
  const_iterator cVar2;
  Span *pSVar3;
  Entry *pEVar4;
  Data *data_00;
  char16_t *pcVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  Flags FVar8;
  uint uVar9;
  QString **ppQVar10;
  Data<QHashPrivate::Node<QString,_long_long>_> *pDVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  bool bVar15;
  byte bVar16;
  uchar *puVar17;
  long in_FS_OFFSET;
  bool bVar18;
  const_iterator cVar19;
  QLatin1StringView s;
  mapped_type_conflict optionOffset;
  QString local_b0;
  QString local_98;
  QString local_78;
  const_iterator local_60;
  undefined1 local_58 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this->needsParsing = false;
  if ((this->errorText).d.ptr != (char16_t *)0x0) {
    data = &((this->errorText).d.d)->super_QArrayData;
    (this->errorText).d.d = (Data *)0x0;
    (this->errorText).d.ptr = (char16_t *)0x0;
    (this->errorText).d.size = 0;
    if (data != (QArrayData *)0x0) {
      LOCK();
      (data->ref_)._q_value.super___atomic_base<int>._M_i =
           (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(data,2,0x10);
      }
    }
  }
  this_00 = &this->positionalArgumentList;
  QList<QString>::clear(this_00);
  QList<QString>::clear(&this->optionNames);
  QList<QString>::clear(&this->unknownOptionNames);
  this_01 = &this->optionValuesHash;
  QHash<long_long,_QList<QString>_>::clear(this_01);
  if ((args->d).size == 0) {
    bVar15 = false;
  }
  else {
    local_60.i = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    ppQVar10 = &(args->d).ptr;
    bVar15 = false;
    bVar16 = 0;
    do {
      cVar2.i = *ppQVar10;
      local_60.i = cVar2.i + 1;
      if (local_60.i == (args->d).ptr + (args->d).size) break;
      local_78.d.d = cVar2.i[1].d.d;
      local_78.d.ptr = cVar2.i[1].d.ptr;
      local_78.d.size = cVar2.i[1].d.size;
      if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)&((local_78.d.d)->super_QArrayData).ref_)->ref_)._q_value.
        super___atomic_base<int>._M_i =
             (((QArrayData *)&((local_78.d.d)->super_QArrayData).ref_)->ref_)._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      if (bVar15) {
        QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                  ((QMovableArrayOps<QString> *)this_00,(this->positionalArgumentList).d.size,
                   &local_78);
        QList<QString>::end(this_00);
        bVar15 = true;
LAB_001667bc:
        bVar18 = local_60.i == (args->d).ptr + (args->d).size;
      }
      else {
        s.m_size = 2;
        s.m_data = "--";
        bVar15 = QString::startsWith(&local_78,s,CaseSensitive);
        if (bVar15) {
          bVar15 = true;
          if (2 < (ulong)local_78.d.size) {
            local_98.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
            local_98.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
            local_98.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
            QString::mid(&local_b0,&local_78,2,-1);
            QString::QString((QString *)local_58,(QChar)0x3d);
LAB_00166894:
            QString::section(&local_98,&local_b0,(QString *)local_58,0,0,(SectionFlags)0x0);
            if ((Data<QHashPrivate::Node<long_long,_QList<QString>_>_> *)local_58._0_8_ !=
                (Data<QHashPrivate::Node<long_long,_QList<QString>_>_> *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i == 0
                 ) {
                QArrayData::deallocate((QArrayData *)local_58._0_8_,2,0x10);
              }
            }
            if (&(local_b0.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_b0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_b0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_b0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_b0.d.d)->super_QArrayData,2,0x10);
              }
            }
            bVar15 = registerFoundOption(this,&local_98);
            bVar1 = 1;
            if (bVar15) {
              bVar15 = parseOptionValue(this,&local_98,&local_78,&local_60,
                                        (args->d).ptr + (args->d).size);
              bVar1 = !bVar15 | bVar16;
            }
LAB_00166d8d:
            bVar16 = bVar1;
            if ((Data<QHashPrivate::Node<long_long,_QList<QString>_>_> *)local_98.d.d !=
                (Data<QHashPrivate::Node<long_long,_QList<QString>_>_> *)0x0) {
              LOCK();
              ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
              }
            }
            bVar15 = false;
          }
          goto LAB_001667bc;
        }
        bVar15 = QString::startsWith(&local_78,(QChar)0x2d,CaseSensitive);
        if (!bVar15) {
          QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                    ((QMovableArrayOps<QString> *)this_00,(this->positionalArgumentList).d.size,
                     &local_78);
          QList<QString>::end(this_00);
          bVar15 = this->optionsAfterPositionalArgumentsMode == ParseAsPositionalArguments;
          goto LAB_001667bc;
        }
        if (local_78.d.size != 1) {
          if (this->singleDashWordOptionMode == ParseAsLongOptions) {
            if (2 < (ulong)local_78.d.size) {
              local_98.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
              local_98.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
              local_98.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
              QString::mid(&local_98,&local_78,1,1);
              cVar19 = QHash<QString,_long_long>::constFindImpl<QString>(&this->nameHash,&local_98);
              pDVar11 = cVar19.i.d;
              bVar15 = true;
              if (pDVar11 != (Data<QHashPrivate::Node<QString,_long_long>_> *)0x0 ||
                  cVar19.i.bucket != 0) {
                uVar14 = cVar19.i.bucket >> 7;
                uVar9 = (uint)cVar19.i.bucket & 0x7f;
                FVar8 = QCommandLineOption::flags
                                  ((this->commandLineOptionList).d.ptr +
                                   *(long *)(pDVar11->spans[uVar14].entries
                                             [pDVar11->spans[uVar14].offsets[uVar9]].storage.data +
                                            0x18));
                if (((uint)FVar8.super_QFlagsStorageHelper<QCommandLineOption::Flag,_4>.
                           super_QFlagsStorage<QCommandLineOption::Flag>.i & 2) != 0) {
                  registerFoundOption(this,&local_98);
                  QHash<long_long,QList<QString>>::tryEmplace_impl<long_long_const&>
                            ((TryEmplaceResult *)local_58,this_01,
                             (longlong *)
                             (pDVar11->spans[uVar14].entries[pDVar11->spans[uVar14].offsets[uVar9]].
                              storage.data + 0x18));
                  pEVar4 = (*(Span **)(local_58._0_8_ + 0x20))[(ulong)local_58._8_8_ >> 7].entries;
                  bVar1 = (*(Span **)(local_58._0_8_ + 0x20))[(ulong)local_58._8_8_ >> 7].offsets
                          [(uint)local_58._8_8_ & 0x7f];
                  puVar17 = pEVar4[bVar1].storage.data + 8;
                  QString::mid((QString *)local_58,&local_78,2,-1);
                  QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                            ((QMovableArrayOps<QString> *)puVar17,
                             *(qsizetype *)(pEVar4[bVar1].storage.data + 0x18),(QString *)local_58);
                  QList<QString>::end((QList<QString> *)puVar17);
                  if ((Data<QHashPrivate::Node<long_long,_QList<QString>_>_> *)local_58._0_8_ !=
                      (Data<QHashPrivate::Node<long_long,_QList<QString>_>_> *)0x0) {
                    LOCK();
                    (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i =
                         (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>.
                         _M_i + -1;
                    UNLOCK();
                    if ((((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>.
                        _M_i == 0) {
                      QArrayData::deallocate((QArrayData *)local_58._0_8_,2,0x10);
                    }
                  }
                  bVar15 = false;
                }
              }
              if ((Data<QHashPrivate::Node<long_long,_QList<QString>_>_> *)local_98.d.d !=
                  (Data<QHashPrivate::Node<long_long,_QList<QString>_>_> *)0x0) {
                LOCK();
                ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
                }
              }
              if (!bVar15) goto LAB_00166d57;
            }
            local_98.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
            local_98.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
            local_98.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
            QString::mid(&local_b0,&local_78,1,-1);
            QString::QString((QString *)local_58,(QChar)0x3d);
            goto LAB_00166894;
          }
          if (this->singleDashWordOptionMode == ParseAsCompactedShortOptions) {
            local_98.d.d = (Data *)0x0;
            local_98.d.ptr = (char16_t *)0x0;
            local_98.d.size = 0;
            if (local_78.d.size != 0) {
              uVar14 = 1;
              do {
                QString::mid((QString *)local_58,&local_78,uVar14,1);
                uVar7 = local_58._16_8_;
                uVar6 = local_58._0_8_;
                pcVar5 = local_98.d.ptr;
                data_00 = local_98.d.d;
                local_58._0_8_ = local_98.d.d;
                local_98.d.d = (Data *)uVar6;
                local_98.d.ptr = (char16_t *)local_58._8_8_;
                local_58._8_8_ = pcVar5;
                local_58._16_8_ = local_98.d.size;
                local_98.d.size = uVar7;
                if ((Data<QHashPrivate::Node<long_long,_QList<QString>_>_> *)data_00 !=
                    (Data<QHashPrivate::Node<long_long,_QList<QString>_>_> *)0x0) {
                  LOCK();
                  (data_00->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       (data_00->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if ((data_00->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
                  {
                    QArrayData::deallocate(&data_00->super_QArrayData,2,0x10);
                  }
                }
                bVar15 = registerFoundOption(this,&local_98);
                if (bVar15) {
                  cVar19 = QHash<QString,_long_long>::constFindImpl<QString>
                                     (&this->nameHash,&local_98);
                  pSVar3 = (cVar19.i.d)->spans;
                  uVar12 = cVar19.i.bucket >> 7;
                  local_b0.d.d = *(Data **)(pSVar3[uVar12].entries
                                            [pSVar3[uVar12].offsets[(uint)cVar19.i.bucket & 0x7f]].
                                            storage.data + 0x18);
                  QCommandLineOption::valueName
                            ((QString *)local_58,
                             (this->commandLineOptionList).d.ptr + (long)local_b0.d.d);
                  uVar6 = local_58._16_8_;
                  if ((Data<QHashPrivate::Node<long_long,_QList<QString>_>_> *)local_58._0_8_ !=
                      (Data<QHashPrivate::Node<long_long,_QList<QString>_>_> *)0x0) {
                    LOCK();
                    (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i =
                         (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>.
                         _M_i + -1;
                    UNLOCK();
                    if ((((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>.
                        _M_i == 0) {
                      QArrayData::deallocate((QArrayData *)local_58._0_8_,2,0x10);
                    }
                  }
                  if ((undefined1 *)uVar6 != (undefined1 *)0x0) {
                    uVar9 = (uint)uVar14 + 1;
                    if ((ulong)uVar9 < (ulong)local_78.d.size) {
                      uVar13 = (uint)uVar14;
                      if (local_78.d.ptr[uVar9] == L'=') {
                        uVar13 = uVar9;
                      }
                      QHash<long_long,QList<QString>>::tryEmplace_impl<long_long_const&>
                                ((TryEmplaceResult *)local_58,this_01,(longlong *)&local_b0);
                      pEVar4 = (*(Span **)(local_58._0_8_ + 0x20))[(ulong)local_58._8_8_ >> 7].
                               entries;
                      bVar1 = (*(Span **)(local_58._0_8_ + 0x20))[(ulong)local_58._8_8_ >> 7].
                              offsets[(uint)local_58._8_8_ & 0x7f];
                      puVar17 = pEVar4[bVar1].storage.data + 8;
                      QString::mid((QString *)local_58,&local_78,(ulong)(uVar13 + 1),-1);
                      QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                                ((QMovableArrayOps<QString> *)puVar17,
                                 *(qsizetype *)(pEVar4[bVar1].storage.data + 0x18),
                                 (QString *)local_58);
                      QList<QString>::end((QList<QString> *)puVar17);
                      bVar1 = bVar16;
                      if ((Data<QHashPrivate::Node<long_long,_QList<QString>_>_> *)local_58._0_8_ !=
                          (Data<QHashPrivate::Node<long_long,_QList<QString>_>_> *)0x0) {
                        LOCK();
                        (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>.
                        _M_i = (((QBasicAtomicInt *)local_58._0_8_)->_q_value).
                               super___atomic_base<int>._M_i + -1;
                        UNLOCK();
                        if ((((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>
                            ._M_i == 0) {
                          QArrayData::deallocate((QArrayData *)local_58._0_8_,2,0x10);
                        }
                      }
                      goto LAB_00166d8d;
                    }
                    break;
                  }
                  if ((uVar14 + 1 < (ulong)local_78.d.size) && (local_78.d.ptr[uVar14 + 1] == L'='))
                  break;
                }
                else {
                  bVar16 = 1;
                }
                uVar14 = uVar14 + 1;
              } while (uVar14 < (ulong)local_78.d.size);
            }
            bVar15 = parseOptionValue(this,&local_98,&local_78,&local_60,
                                      (args->d).ptr + (args->d).size);
            bVar1 = bVar16 | !bVar15;
            goto LAB_00166d8d;
          }
LAB_00166d57:
          bVar15 = false;
          goto LAB_001667bc;
        }
        QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                  ((QMovableArrayOps<QString> *)this_00,(this->positionalArgumentList).d.size,
                   &local_78);
        QList<QString>::end(this_00);
        bVar18 = false;
        bVar15 = false;
      }
      if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
        }
      }
      ppQVar10 = &local_60.i;
    } while (!bVar18);
    bVar15 = (bool)(bVar16 ^ 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar15;
}

Assistant:

bool QCommandLineParserPrivate::parse(const QStringList &args)
{
    needsParsing = false;
    bool error = false;

    const QLatin1Char dashChar('-');
    const QLatin1Char assignChar('=');

    bool forcePositional = false;
    errorText.clear();
    positionalArgumentList.clear();
    optionNames.clear();
    unknownOptionNames.clear();
    optionValuesHash.clear();

    if (args.isEmpty()) {
        qWarning("QCommandLineParser: argument list cannot be empty, it should contain at least the executable name");
        return false;
    }

    QStringList::const_iterator argumentIterator = args.begin();
    ++argumentIterator; // skip executable name

    for (; argumentIterator != args.end() ; ++argumentIterator) {
        QString argument = *argumentIterator;

        if (forcePositional) {
            positionalArgumentList.append(argument);
        } else if (argument.startsWith("--"_L1)) {
            if (argument.size() > 2) {
                QString optionName = argument.mid(2).section(assignChar, 0, 0);
                if (registerFoundOption(optionName)) {
                    if (!parseOptionValue(optionName, argument, &argumentIterator, args.end()))
                        error = true;
                } else {
                    error = true;
                }
            } else {
                forcePositional = true;
            }
        } else if (argument.startsWith(dashChar)) {
            if (argument.size() == 1) { // single dash ("stdin")
                positionalArgumentList.append(argument);
                continue;
            }
            switch (singleDashWordOptionMode) {
            case QCommandLineParser::ParseAsCompactedShortOptions:
            {
                QString optionName;
                bool valueFound = false;
                for (int pos = 1 ; pos < argument.size(); ++pos) {
                    optionName = argument.mid(pos, 1);
                    if (!registerFoundOption(optionName)) {
                        error = true;
                    } else {
                        const NameHash_t::const_iterator nameHashIt = nameHash.constFind(optionName);
                        Q_ASSERT(nameHashIt != nameHash.constEnd()); // checked by registerFoundOption
                        const NameHash_t::mapped_type optionOffset = *nameHashIt;
                        const bool withValue = !commandLineOptionList.at(optionOffset).valueName().isEmpty();
                        if (withValue) {
                            if (pos + 1 < argument.size()) {
                                if (argument.at(pos + 1) == assignChar)
                                    ++pos;
                                optionValuesHash[optionOffset].append(argument.mid(pos + 1));
                                valueFound = true;
                            }
                            break;
                        }
                        if (pos + 1 < argument.size() && argument.at(pos + 1) == assignChar)
                            break;
                    }
                }
                if (!valueFound && !parseOptionValue(optionName, argument, &argumentIterator, args.end()))
                    error = true;
                break;
            }
            case QCommandLineParser::ParseAsLongOptions:
            {
                if (argument.size() > 2) {
                    const QString possibleShortOptionStyleName = argument.mid(1, 1);
                    const auto shortOptionIt = nameHash.constFind(possibleShortOptionStyleName);
                    if (shortOptionIt != nameHash.constEnd()) {
                        const auto &arg = commandLineOptionList.at(*shortOptionIt);
                        if (arg.flags() & QCommandLineOption::ShortOptionStyle) {
                            registerFoundOption(possibleShortOptionStyleName);
                            optionValuesHash[*shortOptionIt].append(argument.mid(2));
                            break;
                        }
                    }
                }
                const QString optionName = argument.mid(1).section(assignChar, 0, 0);
                if (registerFoundOption(optionName)) {
                    if (!parseOptionValue(optionName, argument, &argumentIterator, args.end()))
                        error = true;
                } else {
                    error = true;
                }
                break;
            }
            }
        } else {
            positionalArgumentList.append(argument);
            if (optionsAfterPositionalArgumentsMode == QCommandLineParser::ParseAsPositionalArguments)
                forcePositional = true;
        }
        if (argumentIterator == args.end())
            break;
    }
    return !error;
}